

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

StringView __thiscall anon_unknown.dwarf_6027d3::Db::parseNumber(Db *this,bool AllowNegative)

{
  char *pcVar1;
  char *pcVar2;
  undefined7 in_register_00000031;
  StringView SVar3;
  
  pcVar1 = this->First;
  if ((((int)CONCAT71(in_register_00000031,AllowNegative) != 0) && (pcVar1 != this->Last)) &&
     (*pcVar1 == 'n')) {
    this->First = pcVar1 + 1;
  }
  if ((this->Last != this->First) && ((int)*this->First - 0x30U < 10)) {
    pcVar2 = this->First;
    while ((this->Last != pcVar2 && ((int)*pcVar2 - 0x30U < 10))) {
      pcVar2 = pcVar2 + 1;
      this->First = pcVar2;
    }
    SVar3.Last = pcVar2;
    SVar3.First = pcVar1;
    return SVar3;
  }
  return (StringView)ZEXT816(0);
}

Assistant:

StringView Db::parseNumber(bool AllowNegative) {
  const char *Tmp = First;
  if (AllowNegative)
    consumeIf('n');
  if (numLeft() == 0 || !std::isdigit(*First))
    return StringView();
  while (numLeft() != 0 && std::isdigit(*First))
    ++First;
  return StringView(Tmp, First);
}